

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void encode_ext(upb_encstate *e,upb_Extension *ext,_Bool is_message_set)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  upb_MiniTableExtension *puVar4;
  undefined7 in_register_00000011;
  upb_MiniTable *m;
  ulong uStack_20;
  
  if ((int)CONCAT71(in_register_00000011,is_message_set) == 0) {
    encode_field(e,(upb_Message *)&(ext->data).str_val,
                 (upb_MiniTableSubInternal *)&stack0xfffffffffffffff8,
                 &ext->ext->field_dont_copy_me__upb_internal_use_only);
    return;
  }
  pcVar3 = e->ptr;
  if (pcVar3 == e->buf) {
    encode_longvarint(e,0xc);
  }
  else {
    e->ptr = pcVar3 + -1;
    pcVar3[-1] = '\f';
  }
  puVar4 = ext->ext;
  bVar1 = (puVar4->field_dont_copy_me__upb_internal_use_only).
          descriptortype_dont_copy_me__upb_internal_use_only;
  if (((puVar4->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only
      & 0x10) == 0) {
    if ((ulong)(bVar1 - 1) - 9 < 2) {
      m = (puVar4->sub_dont_copy_me__upb_internal_use_only).
          submsg_dont_copy_me__upb_internal_use_only;
    }
    else {
      m = (upb_MiniTable *)0x0;
    }
  }
  else {
    m = (upb_MiniTable *)0x0;
    if ((bVar1 != 5) && (m = (upb_MiniTable *)0x0, bVar1 != 0xc)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mini_table/internal/field.h"
                    ,0x7b,"upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                   );
    }
  }
  encode_message(e,(ext->data).msg_val,m,&uStack_20);
  if ((uStack_20 < 0x80) && (pcVar3 = e->ptr, pcVar3 != e->buf)) {
    e->ptr = pcVar3 + -1;
    pcVar3[-1] = (char)uStack_20;
  }
  else {
    encode_longvarint(e,uStack_20);
  }
  pcVar3 = e->ptr;
  if (pcVar3 == e->buf) {
    encode_longvarint(e,0x1a);
  }
  else {
    e->ptr = pcVar3 + -1;
    pcVar3[-1] = '\x1a';
  }
  uVar2 = (ext->ext->field_dont_copy_me__upb_internal_use_only).
          number_dont_copy_me__upb_internal_use_only;
  if (((ulong)uVar2 < 0x80) && (pcVar3 = e->ptr, pcVar3 != e->buf)) {
    e->ptr = pcVar3 + -1;
    pcVar3[-1] = (char)uVar2;
  }
  else {
    encode_longvarint(e,(ulong)uVar2);
  }
  pcVar3 = e->ptr;
  if (pcVar3 == e->buf) {
    encode_longvarint(e,0x10);
  }
  else {
    e->ptr = pcVar3 + -1;
    pcVar3[-1] = '\x10';
  }
  pcVar3 = e->ptr;
  if (pcVar3 != e->buf) {
    e->ptr = pcVar3 + -1;
    pcVar3[-1] = '\v';
    return;
  }
  encode_longvarint(e,0xb);
  return;
}

Assistant:

static void encode_ext(upb_encstate* e, const upb_Extension* ext,
                       bool is_message_set) {
  if (UPB_UNLIKELY(is_message_set)) {
    encode_msgset_item(e, ext);
  } else {
    upb_MiniTableSubInternal sub;
    if (upb_MiniTableField_IsSubMessage(&ext->ext->UPB_PRIVATE(field))) {
      sub.UPB_PRIVATE(submsg) = &ext->ext->UPB_PRIVATE(sub).UPB_PRIVATE(submsg);
    } else {
      sub.UPB_PRIVATE(subenum) =
          ext->ext->UPB_PRIVATE(sub).UPB_PRIVATE(subenum);
    }
    encode_field(e, (upb_Message*)&ext->data, &sub,
                 &ext->ext->UPB_PRIVATE(field));
  }
}